

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

size_t vkt::api::anon_unknown_1::getSafeObjectCount
                 (PlatformMemoryLimits *memoryLimits,size_t objectSystemMemoryUsage,
                 VkDeviceSize objectDeviceMemoryUsage)

{
  unsigned_long uVar1;
  VkDeviceSize roundedUpDeviceMemory;
  VkDeviceSize objectDeviceMemoryUsage_local;
  size_t objectSystemMemoryUsage_local;
  PlatformMemoryLimits *memoryLimits_local;
  
  uVar1 = roundUpToNextMultiple<unsigned_long>
                    (objectDeviceMemoryUsage,memoryLimits->deviceMemoryAllocationGranularity);
  if ((memoryLimits->totalDeviceLocalMemory == 0) || (uVar1 == 0)) {
    if (objectSystemMemoryUsage + uVar1 == 0) {
      memoryLimits_local = (PlatformMemoryLimits *)std::numeric_limits<unsigned_long>::max();
    }
    else {
      memoryLimits_local =
           (PlatformMemoryLimits *)
           (memoryLimits->totalSystemMemory / (objectSystemMemoryUsage + uVar1));
    }
  }
  else if (objectSystemMemoryUsage == 0) {
    memoryLimits_local = (PlatformMemoryLimits *)(memoryLimits->totalDeviceLocalMemory / uVar1);
  }
  else {
    memoryLimits_local =
         (PlatformMemoryLimits *)
         de::min<unsigned_long>
                   (memoryLimits->totalSystemMemory / objectSystemMemoryUsage,
                    memoryLimits->totalDeviceLocalMemory / uVar1);
  }
  return (size_t)memoryLimits_local;
}

Assistant:

size_t getSafeObjectCount (const PlatformMemoryLimits&	memoryLimits,
						   size_t						objectSystemMemoryUsage,
						   VkDeviceSize					objectDeviceMemoryUsage = 0)
{
	const VkDeviceSize	roundedUpDeviceMemory	= roundUpToNextMultiple(objectDeviceMemoryUsage, memoryLimits.deviceMemoryAllocationGranularity);

	if (memoryLimits.totalDeviceLocalMemory > 0 && roundedUpDeviceMemory > 0)
	{
		if (objectSystemMemoryUsage > 0)
			return de::min(memoryLimits.totalSystemMemory / objectSystemMemoryUsage,
						   (size_t)(memoryLimits.totalDeviceLocalMemory / roundedUpDeviceMemory));
		else
			return (size_t)(memoryLimits.totalDeviceLocalMemory / roundedUpDeviceMemory);
	}
	else if (objectSystemMemoryUsage + roundedUpDeviceMemory > 0)
	{
		DE_ASSERT(roundedUpDeviceMemory <= std::numeric_limits<size_t>::max() - objectSystemMemoryUsage);
		return memoryLimits.totalSystemMemory / (objectSystemMemoryUsage + (size_t)roundedUpDeviceMemory);
	}
	else
	{
		// Warning: at this point driver has probably not implemented allocation callbacks correctly
		return std::numeric_limits<size_t>::max();
	}
}